

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

action Search::search_predict
                 (search_private *priv,example *ecs,size_t ec_cnt,ptag mytag,action *oracle_actions,
                 size_t oracle_actions_cnt,ptag *condition_on,char *condition_on_names,
                 action *allowed_actions,size_t allowed_actions_cnt,float *allowed_actions_cost,
                 size_t learner_id,float *a_cost,float param_14)

{
  v_array<char> *A;
  SearchState SVar1;
  size_t sVar2;
  scored_action *psVar3;
  uint *__dest;
  action_repr *paVar4;
  v_array<Search::action_cache> *pvVar5;
  polylabel *oracle_actions_00;
  action aVar6;
  uint policy;
  example *peVar7;
  size_t sVar8;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  ulong extraout_RAX;
  BaseTask *pBVar9;
  vw_exception *this;
  ostream *poVar10;
  undefined8 *puVar11;
  byte bVar12;
  ulong uVar13;
  features *pfVar14;
  uint uVar15;
  undefined4 uVar16;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  ulong extraout_RDX_01;
  _func_void_void_ptr_void_ptr *copy_label;
  long lVar18;
  ulong uVar19;
  v_array<Search::action_repr> *v;
  char *pcVar20;
  size_t sVar21;
  search_private *priv_00;
  _func_void_void_ptr_void_ptr *pos;
  size_t i_1;
  _func_void_void_ptr_void_ptr *p_Var22;
  features *pfVar23;
  ulong uVar24;
  size_t i;
  ulong t;
  bool bVar25;
  action_repr item;
  undefined8 uVar26;
  action a;
  undefined4 local_250;
  uint local_24c;
  polylabel *local_248;
  features *local_240;
  uint local_234;
  example *local_230;
  size_t local_228;
  size_t local_220;
  int local_214;
  ulong local_210;
  undefined4 local_204;
  features *local_200;
  string local_1f8;
  string local_1d8 [32];
  stringstream __msg;
  float fStack_1b4;
  ostream local_1a8;
  undefined7 uVar17;
  
  local_220 = CONCAT44(local_220._4_4_,mytag);
  local_230 = ecs;
  if (condition_on_names == (char *)0x0) {
    local_240 = (features *)0x0;
  }
  else {
    local_240 = (features *)strlen(condition_on_names);
  }
  sVar2 = priv->t;
  t = priv->meta_t + sVar2;
  priv->t = sVar2 + 1;
  SVar1 = priv->state;
  if ((SVar1 == GET_TRUTH_STRING) || (priv->force_oracle == true)) {
    aVar6 = choose_oracle_action
                      (priv,ec_cnt,oracle_actions,oracle_actions_cnt,allowed_actions,
                       allowed_actions_cnt,allowed_actions_cost);
    *a_cost = 0.0;
    return aVar6;
  }
  uVar19 = priv->learn_t;
  local_248 = (polylabel *)oracle_actions;
  if (t < uVar19 && SVar1 == LEARN) {
    psVar3 = (priv->train_trajectory)._begin;
    aVar6 = psVar3[t].a;
    *a_cost = psVar3[t].s;
    pBVar9 = priv->metaoverride;
    if (pBVar9 == (BaseTask *)0x0) {
      return aVar6;
    }
    if (pBVar9->_foreach_action != (_func_void_search_ptr_size_t_float_action_bool_float *)0x0) {
      foreach_action_from_cache(priv,t,0xffffffff);
      pBVar9 = priv->metaoverride;
      if (pBVar9 == (BaseTask *)0x0) {
        return aVar6;
      }
    }
    if (pBVar9->_post_prediction == (_func_void_search_ptr_size_t_action_float *)0x0) {
      return aVar6;
    }
    (*pBVar9->_post_prediction)(pBVar9->sch,t - priv->meta_t,aVar6,*a_cost);
    return aVar6;
  }
  bVar25 = priv->is_ldf;
  sVar21 = ec_cnt;
  if ((bVar25 == false) && (sVar21 = allowed_actions_cnt, allowed_actions_cnt == 0)) {
    sVar21 = priv->A;
  }
  pos = (_func_void_void_ptr_void_ptr *)CONCAT71((int7)((ulong)oracle_actions >> 8),SVar1 == LEARN);
  local_228 = oracle_actions_cnt;
  if (t == uVar19 && SVar1 == LEARN) {
    local_220 = priv->learn_a_idx;
    priv->loss_declared_cnt = 0;
    priv->learn_a_idx = local_220 + 1;
    if (sVar21 <= local_220 + 1) {
      priv->done_with_all_actions = true;
      priv->learn_learner_id = learner_id;
      if (oracle_actions_cnt != 0) {
        priv->learn_oracle_action = *oracle_actions;
      }
      priv->learn_ec_ref_cnt = ec_cnt;
      peVar7 = local_230;
      if (priv->examples_dont_change == false) {
        p_Var22 = (_func_void_void_ptr_void_ptr *)0x0;
        sVar2 = 0x20;
        copy_label = (_func_void_void_ptr_void_ptr *)PTR_copy_label_002a8da8;
        if (bVar25 == false) {
          copy_label = p_Var22;
          sVar2 = 8;
        }
        local_248 = (polylabel *)&priv->learn_ec_copy;
        ensure_size<example>((v_array<example> *)&local_248->simple,ec_cnt);
        while (bVar25 = ec_cnt != 0, ec_cnt = ec_cnt - 1, bVar25) {
          pos = copy_label;
          VW::copy_example_data
                    (priv->all->audit,(example *)(p_Var22 + (long)(priv->learn_ec_copy)._begin),
                     (example *)(p_Var22 + (long)&local_230->super_example_predict),sVar2,copy_label
                    );
          p_Var22 = p_Var22 + 0x68d0;
        }
        peVar7 = *(example **)local_248;
      }
      pfVar23 = local_240;
      priv->learn_ec_ref = peVar7;
      if (priv->auto_condition_features == true) {
        ensure_size<unsigned_int>(&priv->learn_condition_on,(size_t)local_240);
        ensure_size<Search::action_repr>(&priv->learn_condition_on_act,(size_t)pfVar23);
        __dest = (priv->learn_condition_on)._begin;
        (priv->learn_condition_on)._end = __dest + (long)pfVar23;
        memcpy(__dest,condition_on,(long)pfVar23 * 4);
        for (pfVar23 = (features *)0x0; local_240 != pfVar23;
            pfVar23 = (features *)((long)&(pfVar23->values)._begin + 1)) {
          uVar19 = (ulong)condition_on[(long)pfVar23];
          if ((uVar19 == 0) ||
             (paVar4 = (priv->ptag_to_action)._begin,
             (ulong)((long)(priv->ptag_to_action)._end - (long)paVar4 >> 4) <= uVar19)) {
            pfVar14 = (features *)0x0;
            v = (v_array<Search::action_repr> *)0x0;
          }
          else {
            v = (v_array<Search::action_repr> *)(ulong)paVar4[uVar19].a;
            pfVar14 = paVar4[uVar19].repr;
          }
          item.repr = pfVar23;
          item._0_8_ = pfVar14;
          push_at<Search::action_repr>((Search *)&priv->learn_condition_on_act,v,item,(size_t)pos);
        }
        A = &priv->learn_condition_on_names;
        if (condition_on_names == (char *)0x0) {
          ensure_size<char>(A,1);
          *A->_begin = '\0';
        }
        else {
          sVar8 = strlen(condition_on_names);
          ensure_size<char>(A,sVar8 + 1);
          strcpy(A->_begin,condition_on_names);
        }
      }
      if (allowed_actions_cnt != 0 && allowed_actions != (action *)0x0) {
        ensure_size<unsigned_int>(&priv->learn_allowed_actions,allowed_actions_cnt);
        memcpy((priv->learn_allowed_actions)._begin,allowed_actions,allowed_actions_cnt * 4);
        std::__cxx11::string::string
                  (local_1d8,"in LEARN, learn_allowed_actions",(allocator *)&__msg);
        std::__cxx11::string::~string(local_1d8);
      }
    }
    sVar2 = local_220;
    *a_cost = 0.0;
    if (allowed_actions_cnt == 0 || allowed_actions == (action *)0x0) {
      aVar6 = (priv->is_ldf ^ 1) + (int)local_220;
    }
    else {
      aVar6 = allowed_actions[local_220 & 0xffffffff];
    }
    if (priv->metaoverride == (BaseTask *)0x0) {
      return aVar6;
    }
    if (priv->metaoverride->_foreach_action !=
        (_func_void_search_ptr_size_t_float_action_bool_float *)0x0) {
      foreach_action_from_cache(priv,t,aVar6);
      pvVar5 = (priv->memo_foreach_action)._begin[t];
      if (pvVar5 != (v_array<Search::action_cache> *)0x0) {
        *a_cost = pvVar5->_begin[sVar2 & 0xffffffff].cost;
      }
    }
    pBVar9 = priv->metaoverride;
    if (pBVar9 == (BaseTask *)0x0) {
      return aVar6;
    }
    if (pBVar9->_post_prediction == (_func_void_search_ptr_size_t_action_float *)0x0) {
      return aVar6;
    }
    (*pBVar9->_post_prediction)(pBVar9->sch,t - priv->meta_t,aVar6,*a_cost);
    return aVar6;
  }
  if (uVar19 < t && SVar1 == LEARN) {
    if (priv->rollout_num_steps - 1 < priv->loss_declared_cnt) {
      aVar6 = 0;
      if (bVar25 == false) {
        if (allowed_actions_cnt == 0 || allowed_actions == (action *)0x0) {
          aVar6 = 1;
        }
        else {
          aVar6 = *allowed_actions;
        }
      }
      pBVar9 = priv->metaoverride;
      if (pBVar9 != (BaseTask *)0x0) {
        if (pBVar9->_post_prediction != (_func_void_search_ptr_size_t_action_float *)0x0) {
          (*pBVar9->_post_prediction)(pBVar9->sch,sVar2,aVar6,0.0);
          pBVar9 = priv->metaoverride;
          if (pBVar9 == (BaseTask *)0x0) goto LAB_0011dc06;
        }
        if (pBVar9->_foreach_action != (_func_void_search_ptr_size_t_float_action_bool_float *)0x0)
        {
          foreach_action_from_cache(priv,t,0xffffffff);
        }
      }
LAB_0011dc06:
      *a_cost = 0.0;
      return aVar6;
    }
LAB_0011d66b:
    if (t <= uVar19) {
LAB_0011df1f:
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::operator<<(&local_1a8,"error: predict called in unknown state");
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search.cc"
                 ,0x749,&local_1f8);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
  }
  else if (1 < SVar1 - INIT_TEST) {
    if (SVar1 != LEARN) goto LAB_0011df1f;
    goto LAB_0011d66b;
  }
  uVar26 = 0x11d67f;
  policy = choose_policy(priv,true);
  a = 0;
  local_24c = 0;
  if (((priv->state == INIT_TRAIN) && (local_24c = 0, priv->rollout_method == NO_ROLLOUT)) &&
     (local_24c = 1, local_228 == 0)) {
    local_24c = (uint)priv->use_action_costs;
  }
  *a_cost = 0.0;
  pBVar9 = priv->metaoverride;
  if (((pBVar9 == (BaseTask *)0x0) ||
      (pBVar9->_maybe_override_prediction ==
       (_func_bool_search_ptr_size_t_action_ptr_float_ptr *)0x0)) || (priv->state == LEARN)) {
LAB_0011d8e9:
    if (policy == 0xffffffff) {
      a = choose_oracle_action
                    (priv,ec_cnt,(action *)&local_248->empty,local_228,allowed_actions,
                     allowed_actions_cnt,allowed_actions_cost);
      local_250 = 0;
      goto LAB_0011d920;
    }
    local_250 = 0;
LAB_0011d8f6:
    uVar15 = 0;
    bVar12 = (byte)local_24c;
  }
  else {
    uVar26 = 0x11d89a;
    bVar25 = (*pBVar9->_maybe_override_prediction)(pBVar9->sch,t - priv->meta_t,&a,a_cost);
    if (!bVar25) goto LAB_0011d8e9;
    bVar25 = need_memo_foreach_action(priv);
    uVar26 = extraout_RDX;
    uVar17 = extraout_var;
    if (bVar25) {
      ___msg = 0;
      fStack_1b4 = 0.0;
      v_array<v_array<Search::action_cache>_*>::push_back
                (&priv->memo_foreach_action,(v_array<Search::action_cache> **)&__msg);
      uVar26 = extraout_RDX_00;
      uVar17 = extraout_var_00;
    }
    local_250 = (undefined4)CONCAT71(uVar17,1);
    if (policy != 0xffffffff) goto LAB_0011d8f6;
LAB_0011d920:
    bVar12 = (byte)local_24c;
    if (priv->metaoverride == (BaseTask *)0x0) {
      uVar15 = 0;
    }
    else {
      uVar15 = (uint)CONCAT71((int7)((ulong)uVar26 >> 8),
                              priv->metaoverride->_foreach_action !=
                              (_func_void_search_ptr_size_t_float_action_bool_float *)0x0);
    }
  }
  local_210 = (ulong)policy;
  if ((-1 < (int)policy || (bVar12 & 1) != 0) || ((char)uVar15 != '\0')) {
    lVar18 = 8;
    local_234 = uVar15;
    local_214 = select_learner(priv,policy,learner_id,false,priv->state != INIT_TEST);
    ensure_size<Search::action_repr>(&priv->condition_on_actions,(size_t)local_240);
    peVar7 = local_230;
    uVar19 = extraout_RAX;
    uVar24 = extraout_RDX_01;
    for (pfVar23 = (features *)0x0; local_240 != pfVar23;
        pfVar23 = (features *)((long)&(pfVar23->values)._begin + 1)) {
      uVar13 = (ulong)condition_on[(long)pfVar23];
      if ((uVar13 == 0) ||
         (paVar4 = (priv->ptag_to_action)._begin,
         (ulong)((long)(priv->ptag_to_action)._end - (long)paVar4 >> 4) <= uVar13)) {
        pfVar14 = (features *)0x0;
        uVar24 = 0;
      }
      else {
        uVar24 = (ulong)paVar4[uVar13].a;
        uVar19 = (ulong)*(uint *)&paVar4[uVar13].field_0x4;
        pfVar14 = paVar4[uVar13].repr;
      }
      paVar4 = (priv->condition_on_actions)._begin;
      *(int *)((long)paVar4 + lVar18 + -8) = (int)uVar24;
      *(int *)((long)paVar4 + lVar18 + -4) = (int)uVar19;
      *(features **)((long)&paVar4->a + lVar18) = pfVar14;
      lVar18 = lVar18 + 0x10;
    }
    uVar17 = (undefined7)(uVar24 >> 8);
    uVar16 = (undefined4)CONCAT71(uVar17,1);
    if (priv->all->training != false) {
      uVar16 = (undefined4)CONCAT71(uVar17,local_230->test_only);
      if ((((byte)local_250 | (byte)local_234 | local_230->test_only) & 1) == 0) {
        bVar25 = cached_action_store_or_find
                           (priv,(ptag)local_220,condition_on,condition_on_names,
                            (priv->condition_on_actions)._begin,(size_t)local_240,(int)local_210,
                            learner_id,&a,false,a_cost);
        if (bVar25) {
          priv->total_cache_hits = priv->total_cache_hits + 1;
          goto LAB_0011deaf;
        }
        uVar16 = 0;
      }
    }
    local_204 = uVar16;
    if (priv->is_ldf == true) {
      bVar25 = COST_SENSITIVE::ec_is_example_header(peVar7);
      uVar19 = (ulong)bVar25;
    }
    else {
      uVar19 = 0;
    }
    priv_00 = (search_private *)&priv->last_action_repr;
    local_200 = (features *)priv_00;
    features::clear((features *)priv_00);
    if (priv->auto_condition_features == true) {
      peVar7 = local_230 + uVar19;
      for (uVar24 = uVar19; uVar24 < ec_cnt; uVar24 = uVar24 + 1) {
        priv_00 = priv;
        add_example_conditioning
                  (priv,peVar7,(size_t)local_240,condition_on_names,
                   (priv->condition_on_actions)._begin);
        peVar7 = peVar7 + 1;
      }
    }
    peVar7 = local_230;
    if ((~(byte)local_250 & -1 < (int)local_210) != 0 || (local_234 & 1) != 0) {
      if ((priv->auto_condition_features == true) && ((priv->acset).use_passthrough_repr == true)) {
        if (priv->is_ldf == true) {
          pcVar20 = "search cannot use state representations in ldf mode";
LAB_0011dfaf:
          poVar10 = std::operator<<((ostream *)&std::cerr,pcVar20);
          std::endl<char,std::char_traits<char>>(poVar10);
          puVar11 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar11 = exit;
          __cxa_throw(puVar11,&std::exception::typeinfo,std::exception::~exception);
        }
        if (local_230->passthrough != (features *)0x0) {
          pcVar20 = "search cannot passthrough";
          goto LAB_0011dfaf;
        }
        local_230->passthrough = local_200;
      }
      aVar6 = a;
      if ((byte)local_234 == '\0') {
        aVar6 = 0xffffffff;
      }
      if (priv->is_ldf == true) {
        priv_00 = priv;
        a = single_prediction_LDF(priv,local_230,ec_cnt,local_214,a_cost,aVar6);
      }
      else {
        priv_00 = priv;
        a = single_prediction_notLDF
                      (priv,local_230,local_214,allowed_actions,allowed_actions_cnt,
                       allowed_actions_cost,a_cost,aVar6);
      }
      peVar7->passthrough = (features *)0x0;
    }
    oracle_actions_00 = local_248;
    if ((char)local_24c != '\0') {
      local_248 = &priv->gte_label;
      allowed_actions_to_label
                (priv,ec_cnt,allowed_actions,allowed_actions_cnt,allowed_actions_cost,
                 (action *)&oracle_actions_00->empty,local_228,local_248);
      priv->learn_ec_ref = peVar7;
      priv->learn_ec_ref_cnt = ec_cnt;
      if (allowed_actions != (action *)0x0) {
        ensure_size<unsigned_int>(&priv->learn_allowed_actions,allowed_actions_cnt);
        memcpy((priv->learn_allowed_actions)._begin,allowed_actions,allowed_actions_cnt << 2);
      }
      sVar2 = priv->learn_learner_id;
      priv->learn_learner_id = learner_id;
      priv_00 = priv;
      generate_training_example(priv,local_248,1.0,false,3.4028235e+38);
      priv->learn_learner_id = sVar2;
      peVar7 = local_230;
    }
    if (priv->auto_condition_features == true) {
      peVar7 = peVar7 + uVar19;
      for (; uVar19 < ec_cnt; uVar19 = uVar19 + 1) {
        del_example_conditioning(priv_00,peVar7);
        peVar7 = peVar7 + 1;
      }
    }
    if ((((byte)local_250 | (byte)local_204) & 1) == 0) {
      cached_action_store_or_find
                (priv,(ptag)local_220,condition_on,condition_on_names,
                 (priv->condition_on_actions)._begin,(size_t)local_240,(int)local_210,learner_id,&a,
                 true,a_cost);
    }
  }
LAB_0011deaf:
  if (priv->state == INIT_TRAIN) {
    fStack_1b4 = *a_cost;
    ___msg = a;
    v_array<Search::scored_action>::push_back(&priv->train_trajectory,(scored_action *)&__msg);
  }
  pBVar9 = priv->metaoverride;
  if ((pBVar9 != (BaseTask *)0x0) &&
     (pBVar9->_post_prediction != (_func_void_search_ptr_size_t_action_float *)0x0)) {
    (*pBVar9->_post_prediction)(pBVar9->sch,t - priv->meta_t,a,*a_cost);
  }
  return a;
}

Assistant:

action search_predict(search_private& priv, example* ecs, size_t ec_cnt, ptag mytag, const action* oracle_actions,
    size_t oracle_actions_cnt, const ptag* condition_on, const char* condition_on_names, const action* allowed_actions,
    size_t allowed_actions_cnt, const float* allowed_actions_cost, size_t learner_id, float& a_cost, float /* weight */)
{
  size_t condition_on_cnt = condition_on_names ? strlen(condition_on_names) : 0;
  size_t t = priv.t + priv.meta_t;
  priv.t++;

  // make sure parameters come in pairs correctly
  assert((oracle_actions == nullptr) == (oracle_actions_cnt == 0));
  assert((condition_on == nullptr) == (condition_on_names == nullptr));
  assert(((allowed_actions == nullptr) && (allowed_actions_cost == nullptr)) == (allowed_actions_cnt == 0));
  assert(priv.use_action_costs == (allowed_actions_cost != nullptr));
  if (allowed_actions_cost != nullptr)
    assert(oracle_actions == nullptr);

  // if we're just after the string, choose an oracle action
  if ((priv.state == GET_TRUTH_STRING) || priv.force_oracle)
  {
    action a = choose_oracle_action(
        priv, ec_cnt, oracle_actions, oracle_actions_cnt, allowed_actions, allowed_actions_cnt, allowed_actions_cost);
    // if (priv.metaoverride && priv.metaoverride->_post_prediction)
    //  priv.metaoverride->_post_prediction(*priv.metaoverride->sch, t-priv.meta_t, a, 0.);
    a_cost = 0.;
    return a;
  }

  // if we're in LEARN mode and before learn_t, return the train action
  if ((priv.state == LEARN) && (t < priv.learn_t))
  {
    assert(t < priv.train_trajectory.size());
    action a = priv.train_trajectory[t].a;
    a_cost = priv.train_trajectory[t].s;
    cdbg << "LEARN " << t << " < priv.learn_t ==> a=" << a << ", a_cost=" << a_cost << endl;
    if (priv.metaoverride && priv.metaoverride->_foreach_action)
      foreach_action_from_cache(priv, t);
    if (priv.metaoverride && priv.metaoverride->_post_prediction)
      priv.metaoverride->_post_prediction(*priv.metaoverride->sch, t - priv.meta_t, a, a_cost);
    return a;
  }

  // for LDF, # of valid actions is ec_cnt; otherwise it's either allowed_actions_cnt or A
  size_t valid_action_cnt = priv.is_ldf ? ec_cnt : (allowed_actions_cnt > 0) ? allowed_actions_cnt : priv.A;

  // if we're in LEARN mode and _at_ learn_t, then:
  //   - choose the next action
  //   - decide if we're done
  //   - if we are, then copy/mark the example ref
  if ((priv.state == LEARN) && (t == priv.learn_t))
  {
    action a = (action)priv.learn_a_idx;
    priv.loss_declared_cnt = 0;

    cdbg << "LEARN " << t << " = priv.learn_t ==> a=" << a << ", learn_a_idx=" << priv.learn_a_idx
         << " valid_action_cnt=" << valid_action_cnt << endl;
    priv.learn_a_idx++;

    // check to see if we're done with available actions
    if (priv.learn_a_idx >= valid_action_cnt)
    {
      priv.done_with_all_actions = true;
      priv.learn_learner_id = learner_id;

      // set reference or copy example(s)
      if (oracle_actions_cnt > 0)
        priv.learn_oracle_action = oracle_actions[0];
      priv.learn_ec_ref_cnt = ec_cnt;
      if (priv.examples_dont_change)
        priv.learn_ec_ref = ecs;
      else
      {
        size_t label_size = priv.is_ldf ? sizeof(CS::label) : sizeof(MC::label_t);
        void (*label_copy_fn)(void*, void*) = priv.is_ldf ? CS::cs_label.copy_label : nullptr;

        ensure_size(priv.learn_ec_copy, ec_cnt);
        for (size_t i = 0; i < ec_cnt; i++)
          VW::copy_example_data(priv.all->audit, priv.learn_ec_copy.begin() + i, ecs + i, label_size, label_copy_fn);

        priv.learn_ec_ref = priv.learn_ec_copy.begin();
      }

      // copy conditioning stuff and allowed actions
      if (priv.auto_condition_features)
      {
        ensure_size(priv.learn_condition_on, condition_on_cnt);
        ensure_size(priv.learn_condition_on_act, condition_on_cnt);

        priv.learn_condition_on.end() =
            priv.learn_condition_on.begin() + condition_on_cnt;  // allow .size() to be used in lieu of _cnt

        memcpy(priv.learn_condition_on.begin(), condition_on, condition_on_cnt * sizeof(ptag));

        for (size_t i = 0; i < condition_on_cnt; i++)
          push_at(priv.learn_condition_on_act,
              action_repr(((1 <= condition_on[i]) && (condition_on[i] < priv.ptag_to_action.size()))
                      ? priv.ptag_to_action[condition_on[i]]
                      : 0),
              i);

        if (condition_on_names == nullptr)
        {
          ensure_size(priv.learn_condition_on_names, 1);
          priv.learn_condition_on_names[0] = 0;
        }
        else
        {
          ensure_size(priv.learn_condition_on_names, strlen(condition_on_names) + 1);
          strcpy(priv.learn_condition_on_names.begin(), condition_on_names);
        }
      }

      if (allowed_actions && (allowed_actions_cnt > 0))
      {
        ensure_size(priv.learn_allowed_actions, allowed_actions_cnt);
        memcpy(priv.learn_allowed_actions.begin(), allowed_actions, allowed_actions_cnt * sizeof(action));
        cdbg_print_array("in LEARN, learn_allowed_actions", priv.learn_allowed_actions);
      }
    }

    assert((allowed_actions_cnt == 0) || (a < allowed_actions_cnt));

    a_cost = 0.;
    action a_name = (allowed_actions && (allowed_actions_cnt > 0)) ? allowed_actions[a] : priv.is_ldf ? a : (a + 1);
    if (priv.metaoverride && priv.metaoverride->_foreach_action)
    {
      foreach_action_from_cache(priv, t, a_name);
      if (priv.memo_foreach_action[t])
      {
        cdbg << "@ memo_foreach_action: t=" << t << ", a=" << a << ", cost=" << (*priv.memo_foreach_action[t])[a].cost
             << endl;
        a_cost = (*priv.memo_foreach_action[t])[a].cost;
      }
    }

    a = a_name;

    if (priv.metaoverride && priv.metaoverride->_post_prediction)
      priv.metaoverride->_post_prediction(*priv.metaoverride->sch, t - priv.meta_t, a, a_cost);
    return a;
  }

  if ((priv.state == LEARN) && (t > priv.learn_t) && (priv.rollout_num_steps > 0) &&
      (priv.loss_declared_cnt >= priv.rollout_num_steps))
  {
    cdbg << "... skipping" << endl;
    action a = priv.is_ldf ? 0 : ((allowed_actions && (allowed_actions_cnt > 0)) ? allowed_actions[0] : 1);
    if (priv.metaoverride && priv.metaoverride->_post_prediction)
      priv.metaoverride->_post_prediction(*priv.metaoverride->sch, t - priv.meta_t, a, 0.);
    if (priv.metaoverride && priv.metaoverride->_foreach_action)
      foreach_action_from_cache(priv, t);
    a_cost = 0.;
    return a;
  }

  if ((priv.state == INIT_TRAIN) || (priv.state == INIT_TEST) || ((priv.state == LEARN) && (t > priv.learn_t)))
  {
    // we actually need to run the policy

    int policy = choose_policy(priv);
    action a = 0;

    cdbg << "executing policy " << policy << endl;

    bool gte_here = (priv.state == INIT_TRAIN) && (priv.rollout_method == NO_ROLLOUT) &&
        ((oracle_actions_cnt > 0) || (priv.use_action_costs));
    a_cost = 0.;
    bool skip = false;

    if (priv.metaoverride && priv.metaoverride->_maybe_override_prediction &&
        (priv.state != LEARN))  // if LEARN and t>learn_t,then we cannot allow overrides!
    {
      skip = priv.metaoverride->_maybe_override_prediction(*priv.metaoverride->sch, t - priv.meta_t, a, a_cost);
      cdbg << "maybe_override_prediction --> " << skip << ", a=" << a << ", a_cost=" << a_cost << endl;
      if (skip && need_memo_foreach_action(priv))
        priv.memo_foreach_action.push_back(nullptr);
    }

    if ((!skip) && (policy == -1))
      a = choose_oracle_action(priv, ec_cnt, oracle_actions, oracle_actions_cnt, allowed_actions, allowed_actions_cnt,
          allowed_actions_cost);  // TODO: we probably want to actually get costs for oracle actions???

    bool need_fea = (policy == -1) && priv.metaoverride && priv.metaoverride->_foreach_action;

    if ((policy >= 0) || gte_here || need_fea)  // the last case is we need to do foreach action
    {
      int learner = select_learner(priv, policy, learner_id, false, priv.state != INIT_TEST);

      ensure_size(priv.condition_on_actions, condition_on_cnt);
      for (size_t i = 0; i < condition_on_cnt; i++)
        priv.condition_on_actions[i] = ((1 <= condition_on[i]) && (condition_on[i] < priv.ptag_to_action.size()))
            ? priv.ptag_to_action[condition_on[i]]
            : 0;

      bool not_test = priv.all->training && !ecs[0].test_only;

      if ((!skip) && (!need_fea) && not_test &&
          cached_action_store_or_find(priv, mytag, condition_on, condition_on_names, priv.condition_on_actions.begin(),
              condition_on_cnt, policy, learner_id, a, false, a_cost))
        // if this succeeded, 'a' has the right action
        priv.total_cache_hits++;
      else  // we need to predict, and then cache, and maybe run foreach_action
      {
        size_t start_K = (priv.is_ldf && COST_SENSITIVE::ec_is_example_header(ecs[0])) ? 1 : 0;
        priv.last_action_repr.clear();
        if (priv.auto_condition_features)
          for (size_t n = start_K; n < ec_cnt; n++)
            add_example_conditioning(
                priv, ecs[n], condition_on_cnt, condition_on_names, priv.condition_on_actions.begin());

        if (((!skip) && (policy >= 0)) || need_fea)  // only make a prediction if we're going to use the output
        {
          if (priv.auto_condition_features && priv.acset.use_passthrough_repr)
          {
            if (priv.is_ldf)
            {
              std::cerr << "search cannot use state representations in ldf mode" << endl;
              throw exception();
            }
            if (ecs[0].passthrough)
            {
              std::cerr << "search cannot passthrough" << endl;
              throw exception();
            }
            ecs[0].passthrough = &priv.last_action_repr;
          }
          a = priv.is_ldf ? single_prediction_LDF(priv, ecs, ec_cnt, learner, a_cost, need_fea ? a : (action)-1)
                          : single_prediction_notLDF(priv, *ecs, learner, allowed_actions, allowed_actions_cnt,
                                allowed_actions_cost, a_cost, need_fea ? a : (action)-1);

          cdbg << "passthrough = [";
          for (size_t kk = 0; kk < priv.last_action_repr.size(); kk++)
            cdbg << ' ' << priv.last_action_repr.indicies[kk] << ':' << priv.last_action_repr.values[kk];
          cdbg << " ]" << endl;

          ecs[0].passthrough = nullptr;
        }

        if (need_fea)
        {
          // TODO this
        }

        if (gte_here)
        {
          cdbg << "INIT_TRAIN, NO_ROLLOUT, at least one oracle_actions, a=" << a << endl;
          // we can generate a training example _NOW_ because we're not doing rollouts
          // allowed_actions_to_losses(priv, ec_cnt, allowed_actions, allowed_actions_cnt, oracle_actions,
          // oracle_actions_cnt, losses);
          allowed_actions_to_label(priv, ec_cnt, allowed_actions, allowed_actions_cnt, allowed_actions_cost,
              oracle_actions, oracle_actions_cnt, priv.gte_label);
          cdbg << "priv.gte_label = [";
          for (size_t i = 0; i < priv.gte_label.cs.costs.size(); i++)
            cdbg << ' ' << priv.gte_label.cs.costs[i].class_index << ':' << priv.gte_label.cs.costs[i].x;
          cdbg << " ]" << endl;

          priv.learn_ec_ref = ecs;
          priv.learn_ec_ref_cnt = ec_cnt;
          if (allowed_actions)
          {
            ensure_size(priv.learn_allowed_actions, allowed_actions_cnt);  // TODO: do we really need this?
            memcpy(priv.learn_allowed_actions.begin(), allowed_actions, allowed_actions_cnt * sizeof(action));
          }
          size_t old_learner_id = priv.learn_learner_id;
          priv.learn_learner_id = learner_id;
          generate_training_example(
              priv, priv.gte_label, 1., false);  // this is false because the conditioning has already been added!
          priv.learn_learner_id = old_learner_id;
        }

        if (priv.auto_condition_features)
          for (size_t n = start_K; n < ec_cnt; n++) del_example_conditioning(priv, ecs[n]);

        if (not_test && (!skip))
          cached_action_store_or_find(priv, mytag, condition_on, condition_on_names, priv.condition_on_actions.begin(),
              condition_on_cnt, policy, learner_id, a, true, a_cost);
      }
    }

    if (priv.state == INIT_TRAIN)
      priv.train_trajectory.push_back(scored_action(a, a_cost));  // note the action for future reference

    if (priv.metaoverride && priv.metaoverride->_post_prediction)
      priv.metaoverride->_post_prediction(*priv.metaoverride->sch, t - priv.meta_t, a, a_cost);

    return a;
  }

  THROW("error: predict called in unknown state");
}